

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O1

void Am_Animation_Start_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Time delay;
  Am_Object AStack_28;
  Am_Time local_20;
  Am_Time local_18;
  
  pAVar2 = Am_Object::Get(inter,0xe9,0);
  Am_Time::Am_Time(&local_18,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xcb,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  Am_Time::Am_Time(&local_20,&local_18);
  Am_Object::Am_Object(&AStack_28,inter);
  Am_Register_Timer(&local_20,&AStack_28,0xe8,!bVar1);
  Am_Object::~Am_Object(&AStack_28);
  Am_Time::~Am_Time(&local_20);
  Am_Time::~Am_Time(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animation_Start_Do,
                 (Am_Object inter))
{
  Am_Time delay = inter.Get(Am_REPEAT_DELAY);
  bool once = !(bool)inter.Get(Am_CONTINUOUS);
  Am_Register_Timer(delay, inter, Am_ANIMATION_METHOD, once);
}